

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O2

JL_STATUS JlGetObjectListNextItem
                    (JlDataObject *ListObject,JlDataObject **pNextObject,JlListItem **pEnumerator)

{
  JL_STATUS JVar1;
  JlListItem *pJVar2;
  JlDataObject *pJVar3;
  
  if (pEnumerator == (JlListItem **)0x0 ||
      (pNextObject == (JlDataObject **)0x0 || ListObject == (JlDataObject *)0x0)) {
    return JL_STATUS_INVALID_PARAMETER;
  }
  if (ListObject->Type != JL_DATA_TYPE_LIST) {
    return JL_STATUS_WRONG_TYPE;
  }
  pJVar2 = *pEnumerator;
  if (pJVar2 == (JlListItem *)0x0) {
    pJVar2 = (ListObject->field_2).List.ListHead;
  }
  else {
    if (pJVar2->ParentList != (JlList *)&ListObject->field_2) {
      return JL_STATUS_WRONG_TYPE;
    }
    pJVar2 = pJVar2->Next;
  }
  *pEnumerator = pJVar2;
  if (pJVar2 == (JlListItem *)0x0) {
    JVar1 = JL_STATUS_END_OF_DATA;
    pJVar3 = (JlDataObject *)0x0;
  }
  else {
    pJVar3 = pJVar2->Object;
    JVar1 = JL_STATUS_SUCCESS;
  }
  *pNextObject = pJVar3;
  return JVar1;
}

Assistant:

JL_STATUS
    JlGetObjectListNextItem
    (
        JlDataObject const*     ListObject,
        JlDataObject**          pNextObject,
        JlListItem**            pEnumerator
    )
{
    JL_STATUS jlStatus;

    if(     NULL != ListObject
        &&  NULL != pNextObject
        &&  NULL != pEnumerator )
    {
        if(     JL_DATA_TYPE_LIST == ListObject->Type
            &&  ( NULL == *pEnumerator  || (*pEnumerator)->ParentList == &ListObject->List ) )
        {
            if( NULL == *pEnumerator )
            {
                *pEnumerator = ListObject->List.ListHead;
                if( NULL != ListObject->List.ListHead )
                {
                    *pNextObject = ListObject->List.ListHead->Object;
                    jlStatus = JL_STATUS_SUCCESS;
                }
                else
                {
                    *pNextObject = NULL;
                    jlStatus = JL_STATUS_END_OF_DATA;
                }
            }
            else
            {
                *pEnumerator = (*pEnumerator)->Next;
                if( NULL != *pEnumerator )
                {
                    *pNextObject = (*pEnumerator)->Object;
                    jlStatus = JL_STATUS_SUCCESS;
                }
                else
                {
                    *pNextObject = NULL;
                    jlStatus = JL_STATUS_END_OF_DATA;
                }
            }
        }
        else
        {
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}